

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BitMap.cpp
# Opt level: O1

size_t axl::sl::findBit(size_t *map,size_t pageCount,size_t from)

{
  byte bVar1;
  uint8_t uVar2;
  size_t sVar3;
  size_t *psVar4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = from >> 6;
  sVar3 = 0xffffffffffffffff;
  if (uVar6 < pageCount) {
    lVar5 = (map[uVar6] >> ((byte)from & 0x3f)) << ((byte)from & 0x3f);
    if (lVar5 == 0) {
      psVar4 = map + uVar6;
      lVar5 = uVar6 << 6;
      do {
        psVar4 = psVar4 + 1;
        if (map + pageCount <= psVar4) {
          return 0xffffffffffffffff;
        }
        sVar3 = *psVar4;
        lVar5 = lVar5 + 0x40;
      } while (sVar3 == 0);
      if ((uint32_t)sVar3 == 0) {
        uVar2 = getLoBitIdx32((uint32_t)(sVar3 >> 0x20));
        bVar1 = uVar2 + 0x20;
      }
      else {
        bVar1 = getLoBitIdx32((uint32_t)sVar3);
      }
      sVar3 = (ulong)bVar1 + lVar5;
    }
    else {
      if ((uint32_t)lVar5 == 0) {
        uVar2 = getLoBitIdx32((uint32_t)((ulong)lVar5 >> 0x20));
        bVar1 = uVar2 + 0x20;
      }
      else {
        bVar1 = getLoBitIdx32((uint32_t)lVar5);
      }
      sVar3 = (from & 0xffffffffffffffc0) + (ulong)bVar1;
    }
  }
  return sVar3;
}

Assistant:

size_t
findBit(
	const size_t* map,
	size_t pageCount,
	size_t from
) {
	size_t i = from / AXL_PTR_BITS;
	if (i >= pageCount)
		return -1;

	const size_t* p = map + i;
	from &= AXL_PTR_BITS - 1;
	size_t x = *p & getHiBitmask(from);
	if (x)
		return i * AXL_PTR_BITS + getLoBitIdx(x);

	const size_t* end = map + pageCount;
	for (p++; p < end; p++)
		if (*p != 0)
			return (p - map) * AXL_PTR_BITS + getLoBitIdx(*p);

	return -1;
}